

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O0

void __thiscall CVmObjIterIdx::get_indexed_val(CVmObjIterIdx *this,long idx,vm_val_t *retval)

{
  vm_val_t *in_RDX;
  int32_t in_ESI;
  vm_val_t idx_val;
  vm_val_t coll;
  vm_val_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  vm_val_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  CVmObject *in_stack_ffffffffffffffe0;
  
  get_coll_val((CVmObjIterIdx *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
  if (in_stack_ffffffffffffffd8 == 5) {
    vm_val_t::set_int((vm_val_t *)&stack0xffffffffffffffc8,in_ESI);
    vm_objp(0);
    CVmObject::index_val_ov
              (in_stack_ffffffffffffffe0,
               (vm_val_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  }
  else {
    if (in_stack_ffffffffffffffd8 != 10) {
      err_throw(0);
    }
    vm_val_t::get_as_list(in_RDX);
    CVmObjList::index_list
              ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void CVmObjIterIdx::get_indexed_val(VMG_ long idx, vm_val_t *retval)
{
    vm_val_t coll;
    vm_val_t idx_val;

    /* get my collection value and the next index value */
    get_coll_val(&coll);

    /* check to see if we have an object or a constant list */
    switch(coll.typ)
    {
    case VM_LIST:
        /* it's a constant list - index the constant value */
        CVmObjList::index_list(vmg_ retval, coll.get_as_list(vmg0_), idx);
        break;

    case VM_OBJ:
        /* it's an object - index it */
        idx_val.set_int(idx);
        vm_objp(vmg_ coll.val.obj)
            ->index_val_ov(vmg_ retval, coll.val.obj, &idx_val);
        break;

    default:
        /* 
         *   Anything else is an error.  We really should never be able to
         *   get here, since the only way to instantiate an iterator should
         *   be via the collection object's createIter() method; so if we
         *   get here it must be an internal error, hence we could probably
         *   assert failure here.  Nonetheless, just throw an error, since
         *   this will make for a more pleasant indication of the problem.  
         */
        err_throw(VMERR_CANNOT_INDEX_TYPE);
        break;
    }
}